

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_nopaste(Terminal *term)

{
  Terminal *term_local;
  
  if (term->paste_len != L'\0') {
    safefree(term->paste_buffer);
    term_bracketed_paste_stop(term);
    term->paste_buffer = (wchar_t *)0x0;
    term->paste_len = L'\0';
  }
  return;
}

Assistant:

void term_nopaste(Terminal *term)
{
    if (term->paste_len == 0)
        return;
    sfree(term->paste_buffer);
    term_bracketed_paste_stop(term);
    term->paste_buffer = NULL;
    term->paste_len = 0;
}